

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O0

int Sbd_ProblemSolve(Gia_Man_t *p,Vec_Int_t *vMirrors,int Pivot,Vec_Int_t *vWinObjs,
                    Vec_Int_t *vObj2Var,Vec_Int_t *vTfo,Vec_Int_t *vRoots,Vec_Int_t *vDivSet,
                    int nStrs,Sbd_Str_t *pStr0)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *p_00;
  sat_solver *pSat;
  sat_solver *s;
  int *begin;
  int *end;
  uint local_88c;
  int status;
  int RetValue;
  int nIters;
  int iLit;
  int iVar;
  int i;
  int pVarsQbf [256];
  int pVarsCec [256];
  int VarQbfFree;
  int VarQbfPar;
  int VarCecPar;
  int VarCecOut;
  int nPars;
  int nVars;
  sat_solver *pSatQbf;
  sat_solver *pSatCec;
  Vec_Int_t *vLits;
  abctime clk;
  int fVerbose;
  Vec_Int_t *vTfo_local;
  Vec_Int_t *vObj2Var_local;
  Vec_Int_t *vWinObjs_local;
  int Pivot_local;
  Vec_Int_t *vMirrors_local;
  Gia_Man_t *p_local;
  
  Abc_Clock();
  p_00 = Vec_IntAlloc(100);
  pSat = Sbd_ManSatSolver((sat_solver *)0x0,p,vMirrors,Pivot,vWinObjs,vObj2Var,vTfo,vRoots,1);
  s = sat_solver_new();
  iVar1 = Vec_IntSize(vDivSet);
  iVar2 = Sbd_ProblemCountParams(nStrs,pStr0);
  iVar3 = Vec_IntSize(vWinObjs);
  iVar4 = Vec_IntSize(vTfo);
  iVar5 = Vec_IntSize(vRoots);
  iVar5 = iVar3 + iVar4 + iVar5;
  iVar3 = iVar5 + nStrs;
  iVar4 = Vec_IntSize(vDivSet);
  if (10 < iVar4) {
    __assert_fail("Vec_IntSize(vDivSet) <= SBD_DIV_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                  ,0xd6,
                  "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                 );
  }
  if (0x100 < iVar1 + nStrs + iVar2) {
    __assert_fail("nVars + nStrs + nPars <= 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                  ,0xd7,
                  "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                 );
  }
  for (iLit = 0; iVar4 = iLit, iVar6 = Vec_IntSize(vDivSet), iVar4 < iVar6; iLit = iLit + 1) {
    nIters = Vec_IntEntry(vDivSet,iLit);
    pVarsQbf[(long)iLit + 0xfe] = nIters;
  }
  for (iLit = 0; iLit < nStrs; iLit = iLit + 1) {
    pVarsQbf[(long)(iVar1 + iLit) + 0xfe] = iVar5 + iLit;
  }
  for (iLit = 0; iLit < iVar2; iLit = iLit + 1) {
    pVarsQbf[(long)(iVar1 + nStrs + iLit) + 0xfe] = iVar3 + iLit;
  }
  for (iLit = 0; iLit < iVar1 + nStrs; iLit = iLit + 1) {
    (&iVar)[iLit] = -1;
  }
  for (iLit = 0; iLit < iVar2; iLit = iLit + 1) {
    (&iVar)[iVar1 + nStrs + iLit] = iLit;
  }
  Sbd_ProblemAddClauses(pSat,iVar1,nStrs,pVarsQbf + 0xfe,pStr0);
  sat_solver_setnvars(s,1000);
  Sbd_ProblemAddClausesInit(s,iVar1,nStrs,&iVar,pStr0);
  Vec_IntClear(p_00);
  for (iLit = 0; iLit < iVar2; iLit = iLit + 1) {
    iVar4 = Abc_Var2Lit(iVar3 + iLit,1);
    Vec_IntPush(p_00,iVar4);
  }
  pVarsCec[0xfe] = iVar2;
  for (status = 0; status < 1 << ((byte)iVar1 & 0x1f); status = status + 1) {
    begin = Vec_IntArray(p_00);
    end = Vec_IntLimit(p_00);
    iVar4 = sat_solver_solve(pSat,begin,end,0,0,0,0);
    if (iVar4 == -1) break;
    if (iVar4 != 1) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                    ,0xf8,
                    "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                   );
    }
    Vec_IntClear(p_00);
    for (iLit = 0; iLit < iVar1 + nStrs; iLit = iLit + 1) {
      (&iVar)[iLit] = pVarsCec[0xfe];
      pVarsCec[0xfe] = pVarsCec[0xfe] + 1;
    }
    for (iLit = 0; iVar4 = iLit, iVar6 = Vec_IntSize(vDivSet), iVar4 < iVar6; iLit = iLit + 1) {
      nIters = Vec_IntEntry(vDivSet,iLit);
      iVar4 = (&iVar)[iLit];
      iVar6 = sat_solver_var_value(pSat,nIters);
      RetValue = Abc_Var2Lit(iVar4,(uint)((iVar6 != 0 ^ 0xffU) & 1));
      iVar4 = sat_solver_addclause(s,&RetValue,&nIters);
      if (iVar4 == 0) {
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                      ,0x10b,
                      "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                     );
      }
    }
    iVar4 = (&iVar)[iVar1];
    iVar6 = sat_solver_var_value(pSat,iVar5);
    RetValue = Abc_Var2Lit(iVar4,iVar6);
    iVar4 = sat_solver_addclause(s,&RetValue,&nIters);
    if (iVar4 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                    ,0x111,
                    "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                   );
    }
    iVar4 = Sbd_ProblemAddClauses(s,iVar1,nStrs,&iVar,pStr0);
    if ((iVar4 == 0) || (iVar4 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0), iVar4 == -1))
    break;
    if (iVar4 != 1) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                    ,0x11b,
                    "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                   );
    }
    iVar4 = Vec_IntSize(p_00);
    if (iVar4 != 0) {
      __assert_fail("Vec_IntSize(vLits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                    ,0x11d,
                    "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                   );
    }
    for (iLit = 0; iLit < iVar2; iLit = iLit + 1) {
      iVar4 = iVar3 + iLit;
      iVar6 = sat_solver_var_value(s,iLit);
      iVar4 = Abc_Var2Lit(iVar4,(uint)((iVar6 != 0 ^ 0xffU) & 1));
      Vec_IntPush(p_00,iVar4);
    }
  }
  iVar1 = Vec_IntSize(p_00);
  if (0 < iVar1) {
    Sbd_ProblemCollectSolution(nStrs,pStr0,p_00);
  }
  local_88c = (uint)(0 < iVar1);
  sat_solver_delete(pSat);
  sat_solver_delete(s);
  Vec_IntFree(p_00);
  return local_88c;
}

Assistant:

int Sbd_ProblemSolve( Gia_Man_t * p, Vec_Int_t * vMirrors, 
                       int Pivot, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, 
                       Vec_Int_t * vTfo, Vec_Int_t * vRoots, 
                       Vec_Int_t * vDivSet, int nStrs, Sbd_Str_t * pStr0 )  // divisors, structures
{
    extern sat_solver * Sbd_ManSatSolver( sat_solver * pSat, Gia_Man_t * p, Vec_Int_t * vMirrors, int Pivot, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, Vec_Int_t * vTfo, Vec_Int_t * vRoots, int fQbf );
    
    int fVerbose = 0;
    abctime clk = Abc_Clock();
    Vec_Int_t * vLits    = Vec_IntAlloc( 100 );
    sat_solver * pSatCec = Sbd_ManSatSolver( NULL, p, vMirrors, Pivot, vWinObjs, vObj2Var, vTfo, vRoots, 1 );
    sat_solver * pSatQbf = sat_solver_new();

    int nVars      = Vec_IntSize( vDivSet );
    int nPars      = Sbd_ProblemCountParams( nStrs, pStr0 );

    int VarCecOut  = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots);
    int VarCecPar  = VarCecOut + nStrs;

    int VarQbfPar  = 0;
    int VarQbfFree = nPars;

    int pVarsCec[256];
    int pVarsQbf[256];
    int i, iVar, iLit, nIters;
    int RetValue = 0;

    assert( Vec_IntSize(vDivSet) <= SBD_DIV_MAX );
    assert( nVars + nStrs + nPars <= 256 );

    // collect CEC variables
    Vec_IntForEachEntry( vDivSet, iVar, i )
        pVarsCec[i] = iVar;
    for ( i = 0; i < nStrs; i++ )
        pVarsCec[nVars + i] = VarCecOut + i;
    for ( i = 0; i < nPars; i++ )
        pVarsCec[nVars + nStrs + i] = VarCecPar + i;

    // collect QBF variables
    for ( i = 0; i < nVars + nStrs; i++ )
        pVarsQbf[i] = -1;
    for ( i = 0; i < nPars; i++ )
        pVarsQbf[nVars + nStrs + i] = VarQbfPar + i;

    // add clauses to the CEC problem
    Sbd_ProblemAddClauses( pSatCec, nVars, nStrs, pVarsCec, pStr0 );

    // create QBF solver
    sat_solver_setnvars( pSatQbf, 1000 );
    Sbd_ProblemAddClausesInit( pSatQbf, nVars, nStrs, pVarsQbf, pStr0 );

    // assume all parameter variables are 0
    Vec_IntClear( vLits );
    for ( i = 0; i < nPars; i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(VarCecPar + i, 1) );
    for ( nIters = 0; nIters < (1 << nVars); nIters++ )
    {
        // check if these parameters solve the problem
        int status = sat_solver_solve( pSatCec, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
        if ( status == l_False ) // solution found
            break;
        assert( status == l_True );

        if ( fVerbose )
        {
            printf( "Iter %3d : ", nIters );
            for ( i = 0; i < nPars; i++ )
                printf( "%d", !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) );
            printf( "    " );
        }

        Vec_IntClear( vLits );
        // create new QBF variables
        for ( i = 0; i < nVars + nStrs; i++ )
            pVarsQbf[i] = VarQbfFree++;
        // set their values
        Vec_IntForEachEntry( vDivSet, iVar, i )
        {
            iLit = Abc_Var2Lit( pVarsQbf[i], !sat_solver_var_value(pSatCec, iVar) );
            status = sat_solver_addclause( pSatQbf, &iLit, &iLit + 1 );
            assert( status );
            if ( fVerbose )
                printf( "%d", sat_solver_var_value(pSatCec, iVar) );
        }
        iLit = Abc_Var2Lit( pVarsQbf[nVars], sat_solver_var_value(pSatCec, VarCecOut) );
        status = sat_solver_addclause( pSatQbf, &iLit, &iLit + 1 );
        assert( status );
        if ( fVerbose )
            printf( " %d\n", !sat_solver_var_value(pSatCec, VarCecOut) );
        // add clauses to the QBF problem
        if ( !Sbd_ProblemAddClauses( pSatQbf, nVars, nStrs, pVarsQbf, pStr0 ) )
            break; // solution does not exist
        // check if solution still exists
        status = sat_solver_solve( pSatQbf, NULL, NULL, 0, 0, 0, 0 );
        if ( status == l_False ) // solution does not exist
            break;
        assert( status == l_True ); 
        // find the new values of parameters
        assert( Vec_IntSize(vLits) == 0 );
        for ( i = 0; i < nPars; i++ )
            Vec_IntPush( vLits, Abc_Var2Lit(VarCecPar + i, !sat_solver_var_value(pSatQbf, VarQbfPar + i)) );
    }
    if ( Vec_IntSize(vLits) > 0 )
    {
        //Sbd_ProblemPrintSolution( nStrs, pStr0, vLits );
        Sbd_ProblemCollectSolution( nStrs, pStr0, vLits );
        RetValue = 1;
    }
    sat_solver_delete( pSatCec );
    sat_solver_delete( pSatQbf );
    Vec_IntFree( vLits );

    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return RetValue;
}